

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

void __thiscall wabt::ObjdumpNames::Set(ObjdumpNames *this,Index index,string_view name)

{
  mapped_type *this_00;
  Index local_44;
  long *local_40 [2];
  long local_30 [2];
  
  local_44 = index;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,name._M_str,name._M_str + name._M_len);
  this_00 = std::
            map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->names,&local_44);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void ObjdumpNames::Set(Index index, std::string_view name) {
  names[index] = std::string(name);
}